

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O0

ecs_table_t *
ecs_table_traverse_add
          (ecs_world_t *world,ecs_table_t *node,ecs_entities_t *to_add,ecs_entities_t *added)

{
  int iVar1;
  int iVar2;
  ecs_entity_t *peVar3;
  ulong e_00;
  ecs_edge_t *peVar4;
  ecs_table_t *local_170;
  ecs_table_t *peStack_160;
  _Bool has_case;
  ecs_table_t *next;
  ecs_edge_t *edge;
  ecs_entity_t e;
  ecs_entities_t owned;
  ecs_entity_t owned_array [32];
  ecs_entity_t *entities;
  int32_t count;
  int32_t i;
  ecs_entities_t *added_local;
  ecs_entities_t *to_add_local;
  ecs_table_t *node_local;
  ecs_world_t *world_local;
  
  iVar1 = to_add->count;
  peVar3 = to_add->array;
  local_170 = node;
  if (node == (ecs_table_t *)0x0) {
    local_170 = &(world->store).root;
  }
  to_add_local = (ecs_entities_t *)local_170;
  e = (ecs_entity_t)&owned.count;
  owned.array._0_4_ = 0;
  entities._4_4_ = 0;
  while( true ) {
    if (iVar1 <= entities._4_4_) {
      if ((int)owned.array != 0) {
        to_add_local = (ecs_entities_t *)
                       ecs_table_traverse_add
                                 (world,(ecs_table_t *)to_add_local,(ecs_entities_t *)&e,added);
      }
      return (ecs_table_t *)to_add_local;
    }
    e_00 = peVar3[entities._4_4_];
    _ecs_assert(e_00 != 0,2,(char *)0x0,"e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x279);
    if (e_00 == 0) break;
    peVar4 = get_edge((ecs_table_t *)to_add_local,e_00);
    peStack_160 = peVar4->add;
    if (peStack_160 == (ecs_table_t *)0x0) {
      peStack_160 = find_or_create_table_include(world,(ecs_table_t *)to_add_local,e_00);
      _ecs_assert(peStack_160 != (ecs_table_t *)0x0,0xc,(char *)0x0,"next != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x280);
      if (peStack_160 == (ecs_table_t *)0x0) {
        __assert_fail("next != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                      ,0x280,
                      "ecs_table_t *ecs_table_traverse_add(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      peVar4->add = peStack_160;
    }
    if ((added != (ecs_entities_t *)0x0) &&
       (((ecs_table_t *)to_add_local != peStack_160 ||
        ((e_00 & 0xff00000000000000) == 0xfc00000000000000)))) {
      iVar2 = added->count;
      added->count = iVar2 + 1;
      added->array[iVar2] = e_00;
    }
    if (((ecs_table_t *)to_add_local != peStack_160) &&
       ((e_00 & 0xff00000000000000) == 0xfe00000000000000)) {
      find_owned_components(world,peStack_160,e_00 & 0xffffffffffffff,(ecs_entities_t *)&e);
    }
    to_add_local = (ecs_entities_t *)peStack_160;
    entities._4_4_ = entities._4_4_ + 1;
  }
  __assert_fail("e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x279,
                "ecs_table_t *ecs_table_traverse_add(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
               );
}

Assistant:

ecs_table_t* ecs_table_traverse_add(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entities_t * to_add,
    ecs_entities_t * added)    
{
    int32_t i, count = to_add->count;
    ecs_entity_t *entities = to_add->array;
    node = node ? node : &world->store.root;

    ecs_entity_t owned_array[ECS_MAX_ADD_REMOVE];
    ecs_entities_t owned = {
        .array = owned_array,
        .count = 0
    };    

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        /* Adding 0 to an entity is not valid */
        ecs_assert(e != 0, ECS_INVALID_PARAMETER, NULL);

        ecs_edge_t *edge = get_edge(node, e);
        ecs_table_t *next = edge->add;

        if (!next) {
            next = find_or_create_table_include(world, node, e);
            ecs_assert(next != NULL, ECS_INTERNAL_ERROR, NULL);
            edge->add = next;
        }

        bool has_case = ECS_HAS_ROLE(e, CASE);
        if (added && (node != next || has_case)) {
            added->array[added->count ++] = e; 
        }

        if ((node != next) && ECS_HAS_ROLE(e, INSTANCEOF)) {
            find_owned_components(world, next, ECS_COMPONENT_MASK & e, &owned);
        }        

        node = next;
    }

    /* In case OWNED components were found, add them as well */
    if (owned.count) {
        node = ecs_table_traverse_add(world, node, &owned, added);
    }

    return node;
}